

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moveGeneration.cpp
# Opt level: O3

void possibleMovesKings(U64 kBoard,U64 FriendlyPieces,arrayMoveList *possibleMoves)

{
  ulong uVar1;
  
  uVar1 = ~FriendlyPieces;
  constantShiftGenerator(kBoard << 8 & uVar1,8,possibleMoves);
  constantShiftGenerator(kBoard << 7 & uVar1 & 0x7f7f7f7f7f7f7f00,7,possibleMoves);
  constantShiftGenerator(kBoard << 9 & uVar1 & 0xfefefefefefefe00,9,possibleMoves);
  constantShiftGenerator(kBoard * 2 & uVar1 & 0xfefefefefefefefe,1,possibleMoves);
  constantShiftGenerator(kBoard >> 1 & uVar1 & 0x7f7f7f7f7f7f7f7f,-1,possibleMoves);
  constantShiftGenerator(kBoard >> 8 & uVar1,-8,possibleMoves);
  constantShiftGenerator(kBoard >> 9 & uVar1 & 0x7f7f7f7f7f7f7f,-9,possibleMoves);
  constantShiftGenerator(kBoard >> 7 & uVar1 & 0xfefefefefefefe,-7,possibleMoves);
  return;
}

Assistant:

void possibleMovesKings(const U64 kBoard, const U64 FriendlyPieces, arrayMoveList& possibleMoves) {
  U64 u = ((kBoard & ~(Rank_8)) << 8) & ~FriendlyPieces;
  constantShiftGenerator(u, 8, possibleMoves);

  U64 ur = ((kBoard & ~(File_H | Rank_8)) << 7) & ~FriendlyPieces;
  constantShiftGenerator(ur, 7, possibleMoves);

  U64 ul = ((kBoard & ~(File_A | Rank_8)) << 9) & ~FriendlyPieces;
  constantShiftGenerator(ul, 9, possibleMoves);

  U64 l = ((kBoard & ~(File_A)) << 1) & ~FriendlyPieces;
  constantShiftGenerator(l, 1, possibleMoves);

  U64 r = ((kBoard & ~(File_H)) >> 1) & ~FriendlyPieces;
  constantShiftGenerator(r, -1, possibleMoves);

  U64 d = ((kBoard & ~(Rank_1)) >> 8) & ~FriendlyPieces;
  constantShiftGenerator(d, -8, possibleMoves);

  U64 dr = ((kBoard & ~(File_H | Rank_1)) >> 9) & ~FriendlyPieces;
  constantShiftGenerator(dr, -9, possibleMoves);

  U64 dl = ((kBoard & ~(File_A | Rank_1)) >> 7) & ~FriendlyPieces;
  constantShiftGenerator(dl, -7, possibleMoves);
}